

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::OptionContext::OptionContext
          (OptionContext *this,string *cap,DescriptionLevel def)

{
  undefined4 in_EDX;
  string *in_RSI;
  long in_RDI;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)0x256788);
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::vector((vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
            *)0x25679b);
  std::
  vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
  ::vector((vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
            *)0x2567ae);
  std::__cxx11::string::string((string *)(in_RDI + 0x60),in_RSI);
  *(undefined4 *)(in_RDI + 0x80) = in_EDX;
  return;
}

Assistant:

OptionContext::OptionContext(const std::string& cap, DescriptionLevel def)
	: caption_(cap)
	, descLevel_(def) {
}